

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupportTestWithFixture_shouldCrashOnFailureWithCppUTestSetting_Test::
~TEST_MockSupportTestWithFixture_shouldCrashOnFailureWithCppUTestSetting_Test
          (TEST_MockSupportTestWithFixture_shouldCrashOnFailureWithCppUTestSetting_Test *this)

{
  TEST_MockSupportTestWithFixture_shouldCrashOnFailureWithCppUTestSetting_Test *this_local;
  
  ~TEST_MockSupportTestWithFixture_shouldCrashOnFailureWithCppUTestSetting_Test(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockSupportTestWithFixture, shouldCrashOnFailureWithCppUTestSetting)
{
    cpputestHasCrashed = false;
    UtestShell::setCrashOnFail();
    UtestShell::setCrashMethod(crashMethod);
    fixture.setTestFunction(unexpectedCallTestFunction_);

    fixture.runAllTests();

    CHECK(cpputestHasCrashed);

    UtestShell::restoreDefaultTestTerminator();
    UtestShell::resetCrashMethod();
}